

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O0

int __thiscall libDAI::MaxPlus::init(MaxPlus *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  reference pVVar3;
  nb_cit I;
  size_t ni;
  const_iterator n;
  VarSet *in_stack_ffffffffffffff98;
  FactorGraph *in_stack_ffffffffffffffa0;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  FactorGraph *local_28;
  Var *local_20;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_18;
  EVP_PKEY_CTX *local_10;
  MaxPlus *local_8;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  *this_00;
  
  local_10 = ctx;
  local_8 = this;
  local_18._M_current = (Var *)VarSet::begin(in_stack_ffffffffffffff98);
  while( true ) {
    local_20 = (Var *)VarSet::end(in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
    this_00 = (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
               *)CONCAT44(extraout_var_00,iVar2);
    pVVar3 = __gnu_cxx::
             __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
             ::operator*(&local_18);
    local_28 = (FactorGraph *)(*(code *)this_00->_M_current[4]._label)(this_00,pVVar3);
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
    FactorGraph::nbV(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    local_30._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffff98);
    while( true ) {
      (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
      FactorGraph::nbV(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff98)
      ;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_ffffffffffffffa0,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_ffffffffffffff98);
      if (!bVar1) break;
      in_stack_ffffffffffffffa0 = local_28;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(&local_30);
      message(this,(size_t)this_00,(size_t)in_stack_ffffffffffffffa0);
      TProb<double>::fill((TProb<double> *)in_stack_ffffffffffffffc0._M_current,
                          (double)in_stack_ffffffffffffffb8._M_current);
      in_stack_ffffffffffffffc0 =
           __gnu_cxx::
           __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)this_00,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    }
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::
         __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
         ::operator++(this_00,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void MaxPlus::init( const VarSet &ns ) {
        for( VarSet::const_iterator n = ns.begin(); n != ns.end(); n++ ) {
            size_t ni = grm().findVar( *n );
            for( FactorGraph::nb_cit I = grm().nbV(ni).begin(); I != grm().nbV(ni).end(); I++ )
                message(ni,*I).fill( 1.0 );
        }
    }